

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.cpp
# Opt level: O0

void crnlib::math::compute_lower_pow2_dim(int *width,int *height)

{
  int iVar1;
  int iVar2;
  int tex_height;
  int tex_width;
  int *height_local;
  int *width_local;
  
  iVar1 = *width;
  iVar2 = *height;
  *width = 1;
  while (*width * 2 <= iVar1) {
    *width = *width << 1;
  }
  *height = 1;
  while (*height * 2 <= iVar2) {
    *height = *height << 1;
  }
  return;
}

Assistant:

void compute_lower_pow2_dim(int& width, int& height)
        {
            const int tex_width = width;
            const int tex_height = height;

            width = 1;
            for (;;)
            {
                if ((width * 2) > tex_width)
                {
                    break;
                }
                width *= 2;
            }

            height = 1;
            for (;;)
            {
                if ((height * 2) > tex_height)
                {
                    break;
                }
                height *= 2;
            }
        }